

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocators.hpp
# Opt level: O3

void __thiscall
nestl::test::allocator_with_state<int>::~allocator_with_state(allocator_with_state<int> *this)

{
  element_type *peVar1;
  shared_count_base *this_00;
  bool bVar2;
  
  bVar2 = impl::shared_ptr::operator_cast_to_bool((shared_ptr *)this);
  if (bVar2) {
    peVar1 = (this->m_allocated_storage).m_ptr;
    if (peVar1 == (element_type *)0x0) {
      __assert_fail("m_ptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/prograholic[P]nestl/nestl/implementation/shared_ptr.hpp"
                    ,0x1e7,
                    "typename shared_ptr<T>::element_type *nestl::impl::shared_ptr<nestl::impl::set<void *>>::operator->() const [T = nestl::impl::set<void *>]"
                   );
    }
    if ((peVar1->m_impl).m_impl.m_node_count != 0) {
      detail::print_tuple<char_const(&)[25]>
                ((ostream *)&std::cerr,(char (*) [25])"memory leaks detected!!!");
      abort();
    }
  }
  this_00 = (this->m_allocated_storage).m_refcount;
  if (this_00 != (shared_count_base *)0x0) {
    impl::shared_count_base::release(this_00);
    return;
  }
  return;
}

Assistant:

~allocator_with_state() NESTL_NOEXCEPT_SPEC
    {
        if (m_allocated_storage && !m_allocated_storage->empty())
        {
            fatal_failure("memory leaks detected!!!");
        }
    }